

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall
ImDrawList::PathBezierQuadraticCurveTo(ImDrawList *this,ImVec2 *p2,ImVec2 *p3,int num_segments)

{
  ImVector<ImVec2> *this_00;
  ImVec2 *pIVar1;
  int iVar2;
  int iVar3;
  ImVec2 local_40;
  ImVec2 p1;
  
  this_00 = &this->_Path;
  pIVar1 = ImVector<ImVec2>::back(this_00);
  p1 = *pIVar1;
  if (num_segments != 0) {
    iVar2 = 0;
    if (0 < num_segments) {
      iVar2 = num_segments;
    }
    for (iVar3 = 1; iVar3 - iVar2 != 1; iVar3 = iVar3 + 1) {
      local_40 = ImBezierQuadraticCalc(&p1,p2,p3,(float)iVar3 * (1.0 / (float)num_segments));
      ImVector<ImVec2>::push_back(this_00,&local_40);
    }
    return;
  }
  PathBezierQuadraticCurveToCasteljau
            (this_00,p1.x,p1.y,p2->x,p2->y,p3->x,p3->y,this->_Data->CurveTessellationTol,0);
  return;
}

Assistant:

void ImDrawList::PathBezierQuadraticCurveTo(const ImVec2& p2, const ImVec2& p3, int num_segments)
{
    ImVec2 p1 = _Path.back();
    if (num_segments == 0)
    {
        PathBezierQuadraticCurveToCasteljau(&_Path, p1.x, p1.y, p2.x, p2.y, p3.x, p3.y, _Data->CurveTessellationTol, 0);// Auto-tessellated
    }
    else
    {
        float t_step = 1.0f / (float)num_segments;
        for (int i_step = 1; i_step <= num_segments; i_step++)
            _Path.push_back(ImBezierQuadraticCalc(p1, p2, p3, t_step * i_step));
    }
}